

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O2

bool __thiscall
clipp::detail::scoped_dfs_traverser::repeat_group_continues(scoped_dfs_traverser *this)

{
  group *pgVar1;
  group *pgVar2;
  
  if (this->repeatGroupContinues_ != true) {
    return false;
  }
  pgVar1 = group::depth_first_traverser::innermost_repeat_group(&this->pos_);
  if ((pgVar1 != (group *)0x0) &&
     (pgVar2 = group::depth_first_traverser::innermost_repeat_group(&this->lastMatch_),
     pgVar1 == pgVar2)) {
    return (this->posAfterLastMatch_).stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           (this->posAfterLastMatch_).stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  }
  return false;
}

Assistant:

bool repeat_group_continues() const
    {
        if(!repeatGroupContinues_) return false;
        const auto curRepGroup = pos_.innermost_repeat_group();
        if(!curRepGroup) return false;
        if(curRepGroup != lastMatch_.innermost_repeat_group()) return false;
        if(!posAfterLastMatch_) return false;
        return true;
    }